

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_diag_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int64_t *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  parasail_result_t *ppVar9;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int64_t *piVar14;
  char *pcVar15;
  uint uVar17;
  int64_t *piVar18;
  int64_t *piVar19;
  int64_t *piVar20;
  char *__format;
  int64_t *piVar21;
  int iVar22;
  int64_t *piVar23;
  int64_t *piVar24;
  int iVar25;
  ulong uVar26;
  int64_t *piVar27;
  uint extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_03;
  uint extraout_XMM0_Dc;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint extraout_XMM0_Da_00;
  ulong uVar28;
  int64_t *piVar29;
  undefined8 extraout_XMM0_Qb;
  ulong uVar48;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar33 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined8 extraout_XMM0_Qa_01;
  uint extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa_02;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Dc_00;
  undefined8 extraout_XMM0_Qb_01;
  uint extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb_02;
  uint extraout_XMM0_Dd_00;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 extraout_XMM0_Qb_03;
  undefined1 extraout_XMM0_01 [16];
  uint uVar49;
  ulong uVar50;
  uint uVar54;
  undefined8 uVar51;
  uint uVar55;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong uVar56;
  uint uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i_64_t B;
  undefined1 auVar62 [16];
  __m128i_64_t B_2;
  __m128i_64_t B_3;
  undefined1 auVar63 [16];
  __m128i_64_t B_4;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  __m128i alVar66;
  int64_t *piVar67;
  int64_t iVar70;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i alVar83;
  __m128i alVar84;
  __m128i alVar85;
  uint local_500;
  undefined1 local_4f8 [16];
  int64_t *local_4e8;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [80];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  int64_t *piStack_420;
  undefined1 local_418 [16];
  uint local_408;
  uint uStack_404;
  uint uStack_400;
  uint uStack_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [32];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [24];
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  int64_t *local_258 [2];
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  long local_1f8;
  long lStack_1f0;
  ulong uStack_1e0;
  int64_t *piStack_1c0;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  int64_t *local_178;
  int64_t *piStack_170;
  int64_t *local_168 [22];
  long local_b8;
  long lStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  long local_88;
  long lStack_80;
  int64_t *local_78;
  int64_t *piStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int64_t *local_48;
  long lStack_40;
  int64_t *piVar16;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "_s2";
LAB_0063a024:
    fprintf(_stderr,__format,"parasail_sg_flags_stats_diag_sse41_128_64",pcVar15);
    return (parasail_result_t *)0x0;
  }
  uVar26 = CONCAT44(0,s2Len);
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar15 = "s2Len";
    goto LAB_0063a024;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar15 = "open";
    goto LAB_0063a024;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar15 = "gap";
    goto LAB_0063a024;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "matrix";
    goto LAB_0063a024;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_sg_flags_stats_diag_sse41_128_64");
      return (parasail_result_t *)0x0;
    }
LAB_00638a4e:
    _s1Len = matrix->length;
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "_s1";
      goto LAB_0063a024;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar15 = "_s1Len";
      goto LAB_0063a024;
    }
    if (matrix->type != 0) goto LAB_00638a4e;
  }
  local_500 = _s1Len - 1;
  iVar11 = matrix->min;
  iVar22 = -open;
  uVar10 = 0x8000000000000000 - (long)iVar11;
  if (iVar11 != iVar22 && SBORROW4(iVar11,iVar22) == iVar11 + open < 0) {
    uVar10 = (ulong)(uint)open | 0x8000000000000000;
  }
  uVar17 = s2Len - 1;
  piVar24 = (int64_t *)(uVar10 + 1);
  local_368._8_8_ = 0x7ffffffffffffffe - (long)matrix->max;
  auVar30._8_4_ = (int)piVar24;
  auVar30._0_8_ = piVar24;
  auVar30._12_4_ = (int)((ulong)piVar24 >> 0x20);
  auVar31 = (undefined1  [16])0x0;
  local_378 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    auVar31._4_4_ = 0;
    auVar31._0_4_ = gap * 2;
    auVar31._8_4_ = gap * 2;
    auVar31._12_4_ = 0;
  }
  piStack_420 = auVar30._8_8_;
  vMaxHRow[1] = (longlong)piStack_420;
  vMaxHRow[0] = (longlong)piVar24;
  local_168[0x13] = piStack_420;
  local_168[0x11] = piStack_420;
  local_168[0xf] = piStack_420;
  vMaxHCol[1] = (longlong)piStack_420;
  vMaxHCol[0] = (longlong)piVar24;
  local_168[0xd] = piStack_420;
  local_168[0xb] = piStack_420;
  local_168[9] = piStack_420;
  local_168[7] = piStack_420;
  local_168[5] = piStack_420;
  local_168[3] = piStack_420;
  local_168[1] = piStack_420;
  local_258[1] = piStack_420;
  piStack_170 = piStack_420;
  if (s1_beg == 0) {
    auVar32._4_4_ = iVar22;
    auVar32._0_4_ = iVar22 - gap;
    auVar32._8_8_ = 0;
    local_378 = pmovsxdq(auVar32,auVar32);
  }
  local_258[0] = piVar24;
  local_178 = piVar24;
  local_168[0] = piVar24;
  local_168[2] = piVar24;
  local_168[4] = piVar24;
  local_168[6] = piVar24;
  local_168[8] = piVar24;
  local_168[10] = piVar24;
  local_168[0xc] = piVar24;
  local_168[0xe] = piVar24;
  local_168[0x10] = piVar24;
  local_168[0x12] = piVar24;
  ppVar9 = parasail_result_new_stats();
  if (ppVar9 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar9->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar9->flag | 0x2811002;
  ptr = parasail_memalign_int64_t(0x10,(long)(int)(_s1Len + 1));
  uVar10 = (ulong)(s2Len + 2);
  ptr_00 = parasail_memalign_int64_t(0x10,uVar10);
  ptr_01 = parasail_memalign_int64_t(0x10,uVar10);
  ptr_02 = parasail_memalign_int64_t(0x10,uVar10);
  ptr_03 = parasail_memalign_int64_t(0x10,uVar10);
  ptr_04 = parasail_memalign_int64_t(0x10,uVar10);
  ptr_05 = parasail_memalign_int64_t(0x10,uVar10);
  ptr_06 = parasail_memalign_int64_t(0x10,uVar10);
  ptr_07 = parasail_memalign_int64_t(0x10,uVar10);
  ptr_08 = parasail_memalign_int64_t(0x10,uVar10);
  auVar58._0_8_ = -(ulong)(ptr == (int64_t *)0x0);
  auVar58._8_8_ = -(ulong)(ptr_00 == (int64_t *)0x0);
  auVar62._0_8_ = -(ulong)(ptr_01 == (int64_t *)0x0);
  auVar62._8_8_ = -(ulong)(ptr_02 == (int64_t *)0x0);
  auVar32 = packssdw(auVar58,auVar62);
  auVar52._0_8_ = -(ulong)(ptr_03 == (int64_t *)0x0);
  auVar52._8_8_ = -(ulong)(ptr_04 == (int64_t *)0x0);
  auVar63._0_8_ = -(ulong)(ptr_05 == (int64_t *)0x0);
  auVar63._8_8_ = -(ulong)(ptr_06 == (int64_t *)0x0);
  auVar58 = packssdw(auVar52,auVar63);
  auVar32 = packssdw(auVar32,auVar58);
  uVar10 = 0;
  if ((ptr_08 == (int64_t *)0x0 || ptr_07 == (int64_t *)0x0) ||
      ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar32 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar32[0xf] < '\0'))
  {
    return (parasail_result_t *)0x0;
  }
  piVar23 = (int64_t *)(long)_s1Len;
  local_a8._0_8_ = (long)_s1Len;
  local_a8._8_4_ = _s1Len;
  local_a8._12_4_ = _s1Len >> 0x1f;
  auVar65._8_4_ = 0xffffffff;
  auVar65._0_8_ = 0xffffffffffffffff;
  auVar65._12_4_ = 0xffffffff;
  local_98._8_4_ = s2Len;
  local_98._0_8_ = uVar26;
  local_98._12_4_ = 0;
  local_b8 = local_a8._0_8_ + -1;
  lStack_b0 = local_a8._8_8_ + auVar65._8_8_;
  local_88 = uVar26 - 1;
  lStack_80 = auVar65._8_8_ + uVar26;
  uVar28 = (ulong)(uint)_s1Len;
  if (_s1Len < 1) {
    uVar28 = uVar10;
  }
  for (; piVar21 = piVar23, uVar28 != uVar10; uVar10 = uVar10 + 1) {
    ptr[uVar10] = (long)matrix->mapper[(byte)_s1[uVar10]];
  }
  for (; (long)piVar21 <= (long)piVar23; piVar21 = (int64_t *)((long)piVar21 + 1)) {
    ptr[(long)piVar21] = 0;
  }
  piVar1 = matrix->mapper;
  for (uVar10 = 0; uVar26 != uVar10; uVar10 = uVar10 + 1) {
    ptr_00[uVar10 + 1] = (long)piVar1[(byte)_s2[uVar10]];
  }
  *ptr_00 = 0;
  for (uVar10 = uVar26; (int)uVar10 <= s2Len; uVar10 = uVar10 + 1) {
    ptr_00[uVar10 + 1] = 0;
  }
  if (s2_beg == 0) {
    lVar12 = (long)iVar22;
    for (lVar13 = 0; uVar26 * 8 - lVar13 != 0; lVar13 = lVar13 + 8) {
      *(long *)((long)ptr_01 + lVar13 + 8) = lVar12;
      *(undefined8 *)((long)ptr_02 + lVar13 + 8) = 0;
      *(undefined8 *)((long)ptr_03 + lVar13 + 8) = 0;
      *(undefined8 *)((long)ptr_04 + lVar13 + 8) = 0;
      *(int64_t **)((long)ptr_05 + lVar13 + 8) = piVar24;
      *(undefined8 *)((long)ptr_06 + lVar13 + 8) = 0;
      *(undefined8 *)((long)ptr_07 + lVar13 + 8) = 0;
      *(undefined8 *)((long)ptr_08 + lVar13 + 8) = 0;
      lVar12 = lVar12 - (ulong)(uint)gap;
    }
  }
  else {
    for (lVar12 = 0; uVar26 * 8 - lVar12 != 0; lVar12 = lVar12 + 8) {
      *(undefined8 *)((long)ptr_01 + lVar12 + 8) = 0;
      *(undefined8 *)((long)ptr_02 + lVar12 + 8) = 0;
      *(undefined8 *)((long)ptr_03 + lVar12 + 8) = 0;
      *(undefined8 *)((long)ptr_04 + lVar12 + 8) = 0;
      *(int64_t **)((long)ptr_05 + lVar12 + 8) = piVar24;
      *(undefined8 *)((long)ptr_06 + lVar12 + 8) = 0;
      *(undefined8 *)((long)ptr_07 + lVar12 + 8) = 0;
      *(undefined8 *)((long)ptr_08 + lVar12 + 8) = 0;
    }
  }
  *ptr_02 = 0;
  *ptr_03 = 0;
  *ptr_04 = 0;
  *ptr_05 = 0;
  *ptr_06 = 0;
  *ptr_07 = 0;
  *ptr_08 = 0;
  piVar21 = ptr_04 + uVar26 + 1;
  for (lVar12 = 0; s2Len + (int)lVar12 <= s2Len; lVar12 = lVar12 + 1) {
    ptr_01[uVar26 + lVar12 + 1] = 0;
    ptr_02[uVar26 + lVar12 + 1] = 0;
    ptr_03[uVar26 + lVar12 + 1] = 0;
    piVar21[lVar12] = 0;
    ptr_05[uVar26 + lVar12 + 1] = 0;
    ptr_06[uVar26 + lVar12 + 1] = 0;
    ptr_07[uVar26 + lVar12 + 1] = 0;
    ptr_08[uVar26 + lVar12 + 1] = 0;
  }
  *ptr_01 = 0;
  local_168[0x14] = piStack_420;
  local_168[0x15] = (int64_t *)0x0;
  local_418._0_12_ = ZEXT812(1);
  local_418._12_4_ = 0;
  piVar18 = (int64_t *)0x0;
  local_268._8_8_ = piStack_420;
  local_268._0_8_ = piVar24;
  local_278._8_8_ = piStack_420;
  local_278._0_8_ = piVar24;
  local_288._8_8_ = piStack_420;
  local_288._0_8_ = piVar24;
  local_298._8_8_ = piStack_420;
  local_298._0_8_ = piVar24;
  local_2a8._8_8_ = piStack_420;
  local_2a8._0_8_ = piVar24;
  local_2b8._8_8_ = piStack_420;
  local_2b8._0_8_ = piVar24;
  local_2c8._8_8_ = piStack_420;
  local_2c8._0_8_ = piVar24;
  local_2d8._8_8_ = piStack_420;
  local_2d8._0_8_ = piVar24;
  local_2e8._8_8_ = piStack_420;
  local_2e8._0_8_ = piVar24;
  local_2f8._8_8_ = piStack_420;
  local_2f8._0_8_ = piVar24;
  local_308._8_8_ = piStack_420;
  local_308._0_8_ = piVar24;
  local_318._8_8_ = piStack_420;
  local_318._0_8_ = piVar24;
  local_368._0_8_ = local_368._8_8_;
  local_358._8_8_ = piStack_420;
  local_358._0_8_ = piVar24;
  while ((long)piVar18 < (long)piVar23) {
    piVar14 = (int64_t *)ptr[(long)piVar18];
    piVar16 = (int64_t *)ptr[(long)piVar18 + 1];
    piVar1 = matrix->matrix;
    alVar85[1] = (long)matrix->size;
    uVar49 = (uint)piVar18 | 1;
    if ((long)piVar23 <= (long)((ulong)piVar18 | 1)) {
      uVar49 = local_500;
    }
    piVar27 = (int64_t *)(long)(int)uVar49;
    piVar20 = piVar18;
    if (matrix->type == 0) {
      piVar27 = piVar16;
      piVar20 = piVar14;
    }
    alVar83[1] = (longlong)piVar23;
    alVar83[0] = (longlong)piVar14;
    alVar85[0] = (longlong)matrix;
    piVar19 = piVar23;
    piVar21 = piVar14;
    _mm_cmplt_epi64_rpl(alVar83,alVar85);
    local_68 = extraout_XMM0_Qa;
    uStack_60 = extraout_XMM0_Qb;
    iVar11 = iVar22 - (uint)piVar18 * gap;
    local_78 = piVar16;
    piStack_70 = piVar14;
    iVar70 = *ptr_01;
    if (s1_beg != 0) {
      iVar11 = 0;
    }
    auVar68._8_8_ = (long)iVar11;
    auVar68._0_8_ = local_168[0x14];
    piVar18 = (int64_t *)((long)piVar18 + 2);
    piVar14 = (int64_t *)((long)iVar22 - (long)piVar18 * (ulong)(uint)gap);
    *ptr_01 = (int64_t)piVar14;
    local_4d8 = (undefined1  [16])0x0;
    uVar28 = -(ulong)(local_418._0_8_ == local_b8);
    uVar48 = -(ulong)(local_418._8_8_ == lStack_b0);
    uVar10 = 0;
    auVar58 = (undefined1  [16])0x0;
    auVar62 = (undefined1  [16])0x0;
    auVar32 = (undefined1  [16])0x0;
    local_4c8._8_8_ = piStack_420;
    local_4c8._0_8_ = piVar24;
    local_3a8._0_8_ = 0;
    local_3a8._8_8_ = 0;
    local_3b8._0_8_ = 0;
    local_3b8._8_8_ = 0;
    local_3f8 = 0;
    uStack_3f0 = 0;
    local_398._8_8_ = piStack_420;
    local_398._0_8_ = piVar24;
    local_468 = (undefined1  [16])0x0;
    local_478 = (undefined1  [16])0x0;
    local_438 = pmovsxbq((undefined1  [16])0x0,0xff);
    piStack_1c0 = piStack_420;
    piVar16 = ptr_01;
    uVar71 = 0;
    uVar72 = 0;
    uVar73 = 0;
    uVar74 = 0;
    uVar75 = 0;
    uVar76 = 0;
    uVar77 = 0;
    uVar78 = 0;
    uVar79 = 0;
    uVar80 = 0;
    uVar81 = 0;
    uVar82 = 0;
    piVar67 = local_168[0x14];
    for (; uVar10 <= uVar26; uVar10 = uVar10 + 1) {
      piVar29 = auVar68._8_8_;
      lStack_40 = ptr_01[uVar10 + 1];
      local_188 = auVar58._8_4_;
      uStack_184 = auVar58._12_4_;
      uStack_180 = (undefined4)ptr_02[uVar10 + 1];
      uStack_17c = (undefined4)((ulong)ptr_02[uVar10 + 1] >> 0x20);
      local_198 = auVar62._8_4_;
      uStack_194 = auVar62._12_4_;
      uStack_190 = (undefined4)ptr_03[uVar10 + 1];
      uStack_18c = (undefined4)((ulong)ptr_03[uVar10 + 1] >> 0x20);
      local_1a8 = auVar32._8_4_;
      uStack_1a4 = auVar32._12_4_;
      uStack_1a0 = (undefined4)ptr_04[uVar10 + 1];
      uStack_19c = (undefined4)((ulong)ptr_04[uVar10 + 1] >> 0x20);
      lVar12 = ptr_05[uVar10 + 1];
      local_4d8._0_8_ = local_4d8._8_8_;
      local_4d8._8_8_ = ptr_06[uVar10 + 1];
      local_468._0_8_ = local_468._8_8_;
      local_468._8_8_ = ptr_07[uVar10 + 1];
      local_478._0_8_ = local_478._8_8_;
      local_478._8_8_ = ptr_08[uVar10 + 1];
      uStack_340 = (undefined4)(lStack_40 - (ulong)(uint)open);
      uStack_33c = (undefined4)(lStack_40 - (ulong)(uint)open >> 0x20);
      uStack_1e0 = (ulong)(uint)gap;
      local_398._0_8_ = local_398._8_8_ - (ulong)(uint)gap;
      local_398._8_8_ = lVar12 - uStack_1e0;
      local_448._8_8_ = uStack_3f0;
      local_448._0_8_ = local_3f8;
      alVar66[1] = (longlong)piVar19;
      alVar66[0] = (longlong)piVar21;
      b[1] = (longlong)piVar14;
      b[0] = (longlong)piVar16;
      local_48 = piVar29;
      alVar83 = _mm_cmpgt_epi64_rpl(alVar66,b);
      b_00[0] = alVar83[1];
      auVar7._8_4_ = uStack_180;
      auVar7._0_8_ = auVar58._8_8_;
      auVar7._12_4_ = uStack_17c;
      local_4d8 = pblendvb(local_4d8,auVar7,extraout_XMM0);
      auVar6._8_4_ = uStack_190;
      auVar6._0_8_ = auVar62._8_8_;
      auVar6._12_4_ = uStack_18c;
      local_468 = pblendvb(local_468,auVar6,extraout_XMM0);
      auVar5._8_4_ = uStack_1a0;
      auVar5._0_8_ = auVar32._8_8_;
      auVar5._12_4_ = uStack_19c;
      auVar52 = pblendvb(local_478,auVar5,extraout_XMM0);
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      local_478._0_8_ = auVar52._0_8_ + 1;
      local_478._8_8_ = auVar52._8_8_ - auVar33._8_8_;
      local_4f8._0_8_ = auVar68._0_8_;
      local_4f8._0_8_ = local_4f8._0_8_ - (ulong)(uint)open;
      local_4f8._8_8_ = (long)piVar29 - (ulong)(uint)open;
      local_4c8._0_8_ = local_4c8._0_8_ - (ulong)(uint)gap;
      local_4c8._8_8_ = local_4c8._8_8_ - uStack_1e0;
      alVar84[1] = (longlong)piVar19;
      alVar84[0] = (longlong)piVar21;
      b_00[1] = (longlong)piVar14;
      alVar83 = _mm_cmpgt_epi64_rpl(alVar84,b_00);
      b_01[0] = alVar83[1];
      auVar65 = pblendvb(local_3a8,auVar58,extraout_XMM0_00);
      auVar63 = pblendvb(local_3b8,auVar62,extraout_XMM0_00);
      auVar32 = pblendvb(local_448,auVar32,extraout_XMM0_00);
      piVar2 = (int64_t *)ptr_00[uVar10 + 1];
      b_01[1] = (long)piVar1[(long)((long)piVar20 * alVar85[1] + (long)piVar2)];
      auVar64._0_8_ = (long)piVar67 + (long)piVar1[(long)piVar27 * alVar85[1] + ptr_00[uVar10]];
      auVar64._8_8_ = iVar70 + b_01[1];
      auVar3._8_4_ = uStack_340;
      auVar3._0_8_ = (long)piVar29 - (ulong)(uint)open;
      auVar3._12_4_ = uStack_33c;
      auVar34._0_8_ = -(ulong)((long)local_398._0_8_ < (long)((long)piVar29 - (ulong)(uint)open));
      auVar34._8_8_ = -(ulong)((long)(lVar12 - uStack_1e0) < auVar3._8_8_);
      local_398._0_16_ = blendvpd(local_398._0_16_,auVar3,auVar34);
      auVar35._0_8_ = -(ulong)((long)local_4c8._0_8_ < (long)local_4f8._0_8_);
      auVar35._8_8_ = -(ulong)((long)local_4c8._8_8_ < (long)((long)piVar29 - (ulong)(uint)open));
      auVar52 = blendvpd(local_4c8._0_16_,local_4f8,auVar35);
      auVar36._0_8_ = -(ulong)(auVar52._0_8_ < auVar64._0_8_);
      auVar36._8_8_ = -(ulong)(auVar52._8_8_ < auVar64._8_8_);
      auVar58 = blendvpd(auVar52,auVar64,auVar36);
      auVar37._0_8_ = -(ulong)(local_398._0_8_ < auVar58._0_8_);
      auVar37._8_8_ = -(ulong)(local_398._8_8_ < auVar58._8_8_);
      auVar68 = blendvpd(local_398._0_16_,auVar58,auVar37);
      auVar58 = blendvpd(local_4d8,auVar65,auVar37);
      auVar38._0_8_ = -(ulong)(auVar64._0_8_ == auVar68._0_8_);
      auVar38._8_8_ = -(ulong)(auVar64._8_8_ == auVar68._8_8_);
      auVar60._0_8_ = CONCAT44(uVar76,uVar75) + (ulong)(local_78 == piStack_1c0);
      auVar60._8_8_ = CONCAT44(uVar78,uVar77) + (ulong)(piStack_70 == piVar2);
      auVar58 = blendvpd(auVar58,auVar60,auVar38);
      auVar62 = blendvpd(local_468,auVar63,auVar37);
      local_448._0_8_ = auVar32._0_8_;
      local_448._8_8_ = auVar32._8_8_;
      local_448._8_8_ = local_448._8_8_ + 1;
      local_448._0_8_ = local_448._0_8_ + 1;
      a[1] = (longlong)piVar19;
      a[0] = (longlong)piVar21;
      _mm_cmpgt_epi64_rpl(a,b_01);
      auVar53._0_8_ = (extraout_XMM0_Qa_00 & 1) + CONCAT44(uVar80,uVar79);
      auVar53._8_8_ = (extraout_XMM0_Qb_00 & 1) + CONCAT44(uVar82,uVar81);
      auVar62 = blendvpd(auVar62,auVar53,auVar38);
      auVar32 = blendvpd(local_478,local_448,auVar37);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar59._0_8_ = CONCAT44(uVar72,uVar71) + 1;
      auVar59._8_8_ = CONCAT44(uVar74,uVar73) - auVar61._8_8_;
      auVar32 = blendvpd(auVar32,auVar59,auVar38);
      auVar69._0_8_ = -(ulong)(local_438._0_8_ == -1);
      auVar69._8_8_ = -(ulong)(local_438._8_8_ == auVar61._8_8_);
      auVar68 = blendvpd(auVar68,local_378,auVar69);
      auVar58 = ~auVar69 & auVar58;
      auVar62 = ~auVar69 & auVar62;
      auVar32 = ~auVar69 & auVar32;
      local_4c8._0_16_ = blendvpd(auVar52,auVar30,auVar69);
      lVar12 = auVar68._0_8_;
      if (1 < uVar10) {
        auVar39._0_8_ = -(ulong)(local_368._0_8_ < lVar12);
        auVar39._8_8_ = -(ulong)(local_368._8_8_ < auVar68._8_8_);
        local_368 = blendvpd(auVar68,local_368,auVar39);
        auVar40._0_8_ = -(ulong)(lVar12 < local_358._0_8_);
        auVar40._8_8_ = -(ulong)(auVar68._8_8_ < local_358._8_8_);
        auVar52 = blendvpd(auVar68,local_358._0_16_,auVar40);
        auVar41._0_8_ = -(ulong)(auVar58._0_8_ < auVar52._0_8_);
        auVar41._8_8_ = -(ulong)(auVar58._8_8_ < auVar52._8_8_);
        auVar52 = blendvpd(auVar58,auVar52,auVar41);
        auVar42._0_8_ = -(ulong)(auVar62._0_8_ < auVar52._0_8_);
        auVar42._8_8_ = -(ulong)(auVar62._8_8_ < auVar52._8_8_);
        auVar52 = blendvpd(auVar62,auVar52,auVar42);
        auVar43._0_8_ = -(ulong)(auVar32._0_8_ < auVar52._0_8_);
        auVar43._8_8_ = -(ulong)(auVar32._8_8_ < auVar52._8_8_);
        local_358._0_16_ = blendvpd(auVar32,auVar52,auVar43);
      }
      auVar52 = ~auVar69 & local_448;
      ptr_01[uVar10] = lVar12;
      ptr_02[uVar10] = auVar58._0_8_;
      ptr_03[uVar10] = auVar62._0_8_;
      ptr_04[uVar10] = auVar32._0_8_;
      ptr_05[uVar10] = local_398._0_8_;
      ptr_06[uVar10] = local_4d8._0_8_;
      ptr_07[uVar10] = local_468._0_8_;
      ptr_08[uVar10] = local_478._0_8_;
      uVar50 = -(ulong)(local_438._0_8_ == local_88);
      uVar56 = -(ulong)(local_438._8_8_ == lStack_80);
      a_00[1] = (longlong)ptr_02;
      a_00[0] = (longlong)ptr_01;
      b_02[1] = (longlong)ptr_04;
      b_02[0] = (longlong)ptr_03;
      piVar14 = ptr_04;
      piVar19 = ptr_02;
      piVar21 = ptr_01;
      alVar83 = _mm_cmpgt_epi64_rpl(a_00,b_02);
      b_03[0] = alVar83[1];
      local_408 = (uint)extraout_XMM0_Qa_01;
      uStack_404 = (uint)((ulong)extraout_XMM0_Qa_01 >> 0x20);
      uStack_400 = (uint)extraout_XMM0_Qb_01;
      uStack_3fc = (uint)((ulong)extraout_XMM0_Qb_01 >> 0x20);
      a_01[1] = (longlong)piVar19;
      a_01[0] = (longlong)piVar21;
      b_03[1] = (longlong)piVar14;
      alVar83 = _mm_cmplt_epi64_rpl(a_01,b_03);
      alVar66 = vMaxHRow;
      b_04[0] = alVar83[1];
      local_448._0_4_ = (undefined4)uVar50;
      local_448._4_4_ = (undefined4)(uVar50 >> 0x20);
      local_448._8_4_ = (undefined4)uVar56;
      local_448._12_4_ = (undefined4)(uVar56 >> 0x20);
      uVar49 = local_448._0_4_ & (uint)local_68;
      uVar54 = local_448._4_4_ & local_68._4_4_;
      uVar55 = local_448._8_4_ & (uint)uStack_60;
      uVar57 = local_448._12_4_ & uStack_60._4_4_;
      local_1b8 = (uint)uVar28;
      uStack_1b4 = (uint)(uVar28 >> 0x20);
      uStack_1b0 = (uint)uVar48;
      uStack_1ac = (uint)(uVar48 >> 0x20);
      a_02[1] = (longlong)piVar19;
      a_02[0] = (longlong)piVar21;
      b_04[1] = (longlong)piVar14;
      alVar84 = _mm_cmpgt_epi64_rpl(a_02,b_04);
      alVar83 = vMaxHCol;
      b_05[0] = alVar84[1];
      a_03[1] = (longlong)piVar19;
      a_03[0] = (longlong)piVar21;
      b_05[1] = (longlong)piVar14;
      local_58 = extraout_XMM0_Qa_02;
      uStack_50 = extraout_XMM0_Qb_02;
      alVar84 = _mm_cmpgt_epi64_rpl(a_03,b_05);
      piVar16 = alVar84[1];
      auVar44._8_8_ = uStack_50;
      auVar44._0_8_ = local_58;
      auVar4._4_4_ = extraout_XMM0_Db & uStack_1b4 & uStack_404;
      auVar4._0_4_ = extraout_XMM0_Da & local_1b8 & local_408;
      auVar4._8_4_ = extraout_XMM0_Dc & uStack_1b0 & uStack_400;
      auVar4._12_4_ = extraout_XMM0_Dd & uStack_1ac & uStack_3fc;
      auVar44 = auVar44 & auVar4;
      alVar66 = (__m128i)pblendvb((undefined1  [16])alVar66,auVar68,auVar44);
      local_318 = pblendvb(local_318,auVar58,auVar44);
      local_308 = pblendvb(local_308,auVar62,auVar44);
      local_2f8 = pblendvb(local_2f8,auVar32,auVar44);
      uVar51 = CONCAT44(extraout_XMM0_Db_00 & uVar54,extraout_XMM0_Da_00 & uVar49);
      uVar55 = extraout_XMM0_Dc_00 & uVar55;
      uVar57 = extraout_XMM0_Dd_00 & uVar57;
      auVar45._8_4_ = uVar55;
      auVar45._0_8_ = uVar51;
      auVar45._12_4_ = uVar57;
      alVar83 = (__m128i)pblendvb((undefined1  [16])alVar83,auVar68,auVar45);
      local_2e8 = pblendvb(local_2e8,auVar58,auVar45);
      local_2d8 = pblendvb(local_2d8,auVar62,auVar45);
      local_2c8 = pblendvb(local_2c8,auVar32,auVar45);
      auVar46._0_8_ = uVar50 & uVar28;
      auVar46._8_4_ = (undefined4)(uVar56 & uVar48);
      auVar46._12_4_ = (undefined4)((uVar56 & uVar48) >> 0x20);
      local_2b8 = blendvpd(local_2b8,auVar68,auVar46);
      local_2a8 = blendvpd(local_2a8,auVar58,auVar46);
      local_298 = blendvpd(local_298,auVar62,auVar46);
      vMaxHRow[0] = alVar66[0];
      vMaxHRow[1] = alVar66[1];
      local_288 = blendvpd(local_288,auVar32,auVar46);
      vMaxHCol[0] = alVar83[0];
      vMaxHCol[1] = alVar83[1];
      auVar47._8_4_ = uVar55;
      auVar47._0_8_ = uVar51;
      auVar47._12_4_ = uVar57;
      local_278 = pblendvb(local_278,local_418,auVar47);
      local_268 = pblendvb(local_268,local_438,auVar44);
      local_438._8_8_ = local_438._8_8_ + 1;
      local_438._0_8_ = local_438._0_8_ + 1;
      local_3a8._0_8_ = SUB168(~auVar69 & auVar65,0);
      local_3a8._8_8_ = SUB168(~auVar69 & auVar65,8);
      local_3b8._0_8_ = SUB168(~auVar69 & auVar63,0);
      local_3b8._8_8_ = SUB168(~auVar69 & auVar63,8);
      local_3f8 = auVar52._0_8_;
      uStack_3f0 = auVar52._8_8_;
      uVar71 = local_1a8;
      uVar72 = uStack_1a4;
      uVar73 = uStack_1a0;
      uVar74 = uStack_19c;
      uVar75 = local_188;
      uVar76 = uStack_184;
      uVar77 = uStack_180;
      uVar78 = uStack_17c;
      uVar79 = local_198;
      uVar80 = uStack_194;
      uVar81 = uStack_190;
      uVar82 = uStack_18c;
      piVar67 = local_48;
      iVar70 = lStack_40;
      piStack_1c0 = piVar2;
    }
    local_418._8_8_ = local_418._8_8_ + 2;
    local_418._0_8_ = local_418._0_8_ + 2;
    local_1f8 = auVar31._0_8_;
    lStack_1f0 = auVar31._8_8_;
    local_378._8_8_ = local_378._8_8_ - lStack_1f0;
    local_378._0_8_ = local_378._0_8_ - local_1f8;
  }
  local_168[0x12] = (int64_t *)local_318._0_8_;
  local_168[0x13] = (int64_t *)local_318._8_8_;
  local_168[0x10] = (int64_t *)local_308._0_8_;
  local_168[0x11] = (int64_t *)local_308._8_8_;
  local_168[0xe] = (int64_t *)local_2f8._0_8_;
  local_168[0xf] = (int64_t *)local_2f8._8_8_;
  local_168[0xc] = (int64_t *)local_2e8._0_8_;
  local_168[0xd] = (int64_t *)local_2e8._8_8_;
  local_168[10] = (int64_t *)local_2d8._0_8_;
  local_168[0xb] = (int64_t *)local_2d8._8_8_;
  local_168[8] = (int64_t *)local_2c8._0_8_;
  local_168[9] = (int64_t *)local_2c8._8_8_;
  local_168[6] = (int64_t *)local_2b8._0_8_;
  local_168[7] = (int64_t *)local_2b8._8_8_;
  local_168[4] = (int64_t *)local_2a8._0_8_;
  local_168[5] = (int64_t *)local_2a8._8_8_;
  local_168[2] = (int64_t *)local_298._0_8_;
  local_168[3] = (int64_t *)local_298._8_8_;
  local_168[0] = (int64_t *)local_288._0_8_;
  local_168[1] = (int64_t *)local_288._8_8_;
  local_258[0] = (int64_t *)local_278._0_8_;
  local_258[1] = (int64_t *)local_278._8_8_;
  local_178 = (int64_t *)local_268._0_8_;
  piStack_170 = (int64_t *)local_268._8_8_;
  lVar12 = 0;
  piVar23 = piVar24;
  piVar14 = piVar24;
  piVar20 = piVar24;
  piVar18 = piVar24;
  local_4e8 = piVar24;
  piVar27 = piVar24;
  piVar16 = piVar24;
  uVar49 = local_500;
  local_4c8._0_8_ = piVar24;
  local_468._0_8_ = piVar24;
  local_478._0_8_ = piVar24;
  local_4f8._0_4_ = uVar17;
  local_4d8._0_8_ = piVar24;
  while( true ) {
    iVar11 = (int)piVar14;
    if ((int)lVar12 == 0x10) break;
    piVar19 = *(int64_t **)((long)vMaxHCol + lVar12);
    if ((long)piVar27 < (long)piVar19) {
      lVar13 = *(long *)((long)local_258 + lVar12);
LAB_00639cb4:
      piVar24 = *(int64_t **)((long)local_168 + lVar12 + 0x60);
      piVar23 = *(int64_t **)((long)local_168 + lVar12 + 0x50);
      piVar18 = *(int64_t **)((long)local_168 + lVar12 + 0x40);
      uVar49 = (uint)lVar13;
      piVar27 = piVar19;
    }
    else if (piVar19 == piVar27) {
      lVar13 = *(long *)((long)local_258 + lVar12);
      piVar21 = (int64_t *)(long)(int)uVar49;
      if (lVar13 < (long)piVar21) goto LAB_00639cb4;
    }
    if ((long)local_4e8 < (long)*(int64_t **)((long)vMaxHRow + lVar12)) {
      local_4f8._0_4_ = *(uint *)((long)&local_178 + lVar12);
      local_4d8._0_8_ = *(undefined8 *)((long)local_168 + lVar12 + 0x90);
      piVar21 = *(int64_t **)((long)local_168 + lVar12 + 0x80);
      piVar14 = *(int64_t **)((long)local_168 + lVar12 + 0x70);
      local_4e8 = *(int64_t **)((long)vMaxHRow + lVar12);
      local_4c8._0_8_ = piVar21;
    }
    piVar19 = *(int64_t **)((long)local_168 + lVar12 + 0x30);
    if ((long)piVar20 < (long)piVar19) {
      local_468._0_8_ = *(undefined8 *)((long)local_168 + lVar12 + 0x20);
      local_478._0_8_ = *(long *)((long)local_168 + lVar12 + 0x10);
      piVar16 = *(int64_t **)((long)local_168 + lVar12);
      piVar20 = piVar19;
    }
    lVar12 = lVar12 + 8;
  }
  piVar14 = (int64_t *)CONCAT71((int7)((ulong)piVar21 >> 8),s2_end == 0);
  piVar21 = piVar24;
  if (s1_end == 0 || s2_end == 0) {
    piVar14 = local_4e8;
    if (s1_end == 0) {
      if (s2_end == 0) {
        piVar14 = piVar20;
        local_4c8._0_8_ = local_478._0_8_;
        iVar11 = (int)piVar16;
        local_4e8 = piVar20;
        local_4f8._0_4_ = uVar17;
        local_4d8._0_8_ = local_468._0_8_;
      }
      goto LAB_00639eef;
    }
  }
  else if ((long)piVar27 <= (long)local_4e8) {
    if ((piVar27 == local_4e8) && (piVar20 = (int64_t *)(ulong)uVar17, local_4f8._0_4_ == uVar17)) {
      local_4c8._0_8_ = piVar23;
      iVar11 = (int)piVar18;
      local_500 = uVar49;
      local_4f8._0_4_ = uVar17;
      local_4d8._0_8_ = piVar24;
    }
    goto LAB_00639eef;
  }
  piVar21 = (int64_t *)(ulong)uVar17;
  local_4c8._0_8_ = piVar23;
  iVar11 = (int)piVar18;
  local_500 = uVar49;
  local_4e8 = piVar27;
  local_4f8._0_4_ = uVar17;
  local_4d8._0_8_ = piVar24;
LAB_00639eef:
  iVar25 = (int)local_4c8._0_8_;
  a_04[1] = (longlong)piVar20;
  a_04[0] = (longlong)piVar14;
  b_06[1] = (longlong)piVar21;
  b_06[0] = (longlong)piVar23;
  alVar85 = _mm_cmplt_epi64_rpl(a_04,b_06);
  b_07[0] = alVar85[1];
  local_4c8._8_8_ = extraout_XMM0_Qb_03;
  local_4c8._0_8_ = extraout_XMM0_Qa_03;
  a_05[1] = (longlong)piVar20;
  a_05[0] = (longlong)piVar14;
  b_07[1] = (longlong)piVar21;
  _mm_cmpgt_epi64_rpl(a_05,b_07);
  local_4c8._0_16_ = extraout_XMM0_01 | local_4c8._0_16_;
  iVar8 = (int)local_4e8;
  iVar22 = (int)local_4d8._0_8_;
  if ((((((((((((((((local_4c8._0_16_ >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (local_4c8._0_16_ >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (local_4c8._0_16_ >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (local_4c8._0_16_ >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (local_4c8._0_16_ >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (local_4c8._0_16_ >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_4c8._0_16_ >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (local_4c8._0_16_ >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_4c8._0_16_ >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (local_4c8._0_16_ >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (local_4c8._0_16_ >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (local_4c8._0_16_ >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_4c8._0_16_ >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (local_4c8._0_16_ >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (local_4c8._0_16_ >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      local_4c8[0xf] < '\0') {
    *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
    iVar11 = 0;
    iVar25 = 0;
    iVar22 = 0;
    iVar8 = 0;
    local_4f8._0_4_ = 0;
    local_500 = 0;
  }
  ppVar9->score = iVar8;
  ppVar9->end_query = local_500;
  ppVar9->end_ref = local_4f8._0_4_;
  ((ppVar9->field_4).stats)->matches = iVar22;
  ((ppVar9->field_4).stats)->similar = iVar25;
  ((ppVar9->field_4).stats)->length = iVar11;
  parasail_free(ptr_08);
  parasail_free(ptr_07);
  parasail_free(ptr_06);
  parasail_free(ptr_05);
  parasail_free(ptr_04);
  parasail_free(ptr_03);
  parasail_free(ptr_02);
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppVar9;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxMRow;
    __m128i vMaxSRow;
    __m128i vMaxLRow;
    __m128i vMaxHCol;
    __m128i vMaxMCol;
    __m128i vMaxSCol;
    __m128i vMaxLCol;
    __m128i vLastValH;
    __m128i vLastValM;
    __m128i vLastValS;
    __m128i vLastValL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxMRow = vNegInf;
    vMaxSRow = vNegInf;
    vMaxLRow = vNegInf;
    vMaxHCol = vNegInf;
    vMaxMCol = vNegInf;
    vMaxSCol = vNegInf;
    vMaxLCol = vNegInf;
    vLastValH = vNegInf;
    vLastValM = vNegInf;
    vLastValS = vNegInf;
    vLastValL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            HM_pr[j] = 0;
            HS_pr[j] = 0;
            HL_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
            FM_pr[j] = 0;
            FS_pr[j] = 0;
            FL_pr[j] = 0;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            HM_pr[j] = 0;
            HS_pr[j] = 0;
            HL_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
            FM_pr[j] = 0;
            FS_pr[j] = 0;
            FL_pr[j] = 0;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vNegInf;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxMRow = _mm_blendv_epi8(vMaxMRow, vWM, cond_all_row);
                vMaxSRow = _mm_blendv_epi8(vMaxSRow, vWS, cond_all_row);
                vMaxLRow = _mm_blendv_epi8(vMaxLRow, vWL, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vMaxMCol = _mm_blendv_epi8(vMaxMCol, vWM, cond_all_col);
                vMaxSCol = _mm_blendv_epi8(vMaxSCol, vWS, cond_all_col);
                vMaxLCol = _mm_blendv_epi8(vMaxLCol, vWL, cond_all_col);
                vLastValH = _mm_blendv_epi8(vLastValH, vWH, cond_last_val);
                vLastValM = _mm_blendv_epi8(vLastValM, vWM, cond_last_val);
                vLastValS = _mm_blendv_epi8(vLastValS, vWS, cond_last_val);
                vLastValL = _mm_blendv_epi8(vLastValL, vWL, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_rowh = NEG_LIMIT;
        int64_t max_rowm = NEG_LIMIT;
        int64_t max_rows = NEG_LIMIT;
        int64_t max_rowl = NEG_LIMIT;
        int64_t max_colh = NEG_LIMIT;
        int64_t max_colm = NEG_LIMIT;
        int64_t max_cols = NEG_LIMIT;
        int64_t max_coll = NEG_LIMIT;
        int64_t last_valh = NEG_LIMIT;
        int64_t last_valm = NEG_LIMIT;
        int64_t last_vals = NEG_LIMIT;
        int64_t last_vall = NEG_LIMIT;
        int64_t *rh = (int64_t*)&vMaxHRow;
        int64_t *rm = (int64_t*)&vMaxMRow;
        int64_t *rs = (int64_t*)&vMaxSRow;
        int64_t *rl = (int64_t*)&vMaxLRow;
        int64_t *ch = (int64_t*)&vMaxHCol;
        int64_t *cm = (int64_t*)&vMaxMCol;
        int64_t *cs = (int64_t*)&vMaxSCol;
        int64_t *cl = (int64_t*)&vMaxLCol;
        int64_t *lh = (int64_t*)&vLastValH;
        int64_t *lm = (int64_t*)&vLastValM;
        int64_t *ls = (int64_t*)&vLastValS;
        int64_t *ll = (int64_t*)&vLastValL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++rh, ++rm, ++rs, ++rl, ++ch, ++cm, ++cs, ++cl, ++lh, ++lm, ++ls, ++ll, ++i, ++j) {
            if (*ch > max_colh || (*ch == max_colh && *i < end_query)) {
                max_colh = *ch;
                end_query = *i;
                max_colm = *cm;
                max_cols = *cs;
                max_coll = *cl;
            }
            if (*rh > max_rowh) {
                max_rowh = *rh;
                end_ref = *j;
                max_rowm = *rm;
                max_rows = *rs;
                max_rowl = *rl;
            }
            if (*lh > last_valh) {
                last_valh = *lh;
                last_valm = *lm;
                last_vals = *ls;
                last_vall = *ll;
            }
        }
        if (s1_end && s2_end) {
            if (max_colh > max_rowh || (max_colh == max_rowh && end_ref == s2Len-1)) {
                score = max_colh;
                end_ref = s2Len-1;
                matches = max_colm;
                similar = max_cols;
                length = max_coll;
            }
            else {
                score = max_rowh;
                end_query = s1Len-1;
                matches = max_rowm;
                similar = max_rows;
                length = max_rowl;
            }
        }
        else if (s1_end) {
            score = max_colh;
            end_ref = s2Len-1;
            matches = max_colm;
            similar = max_cols;
            length = max_coll;
        }
        else if (s2_end) {
            score = max_rowh;
            end_query = s1Len-1;
            matches = max_rowm;
            similar = max_rows;
            length = max_rowl;
        }
        else {
            score = last_valh;
            end_query = s1Len-1;
            end_ref = s2Len-1;
            matches = last_valm;
            similar = last_vals;
            length = last_vall;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}